

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O3

SuffixHandler<double> __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<double>
          (BasicProblem<mp::BasicProblemParams<int>_> *this,StringRef name,int kind)

{
  int num_values;
  BasicMutSuffix<double> BVar1;
  SuffixTable local_48;
  
  num_values = GetSuffixSize(this,kind & PROBLEM);
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  BVar1 = BasicSuffixSet<std::allocator<char>_>::Add<double>
                    ((this->super_SuffixManager).suffixes_ + (kind & PROBLEM),name,kind,num_values,
                     &local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return (BasicMutSuffix<double>)
         (BasicMutSuffix<double>)BVar1.super_BasicSuffix<double>.super_SuffixBase.impl_;
}

Assistant:

SuffixHandler<T> AddSuffix(fmt::StringRef name, int kind) {
    auto main_kind = (suf::Kind)(kind & suf::KIND_MASK);
    return SuffixHandler<T>(
          suffixes(main_kind).template Add<T>(name, kind, GetSuffixSize(main_kind)));
  }